

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>::
Action<ProcessFileNameFreeBSD_LengthIncreasesOnEachIteration_Test::TestBody()::__0_const&,void>
          (Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>
           *this,anon_class_8_1_8713552d_for__M_head_impl *fun)

{
  anon_class_8_1_8713552d_for__M_head_impl *fun_local;
  Action<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>
  *this_local;
  
  std::
  function<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>::
  function((function<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>
            *)this);
  Init<ProcessFileNameFreeBSD_LengthIncreasesOnEachIteration_Test::TestBody()::__0_const&>(this,fun)
  ;
  return;
}

Assistant:

Action(G&& fun) {  // NOLINT
    Init(::std::forward<G>(fun), IsCompatibleFunctor<G>());
  }